

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O0

void __thiscall GibbsSamplerFromHDP::checkNumbers(GibbsSamplerFromHDP *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  size_type sVar5;
  bool bVar6;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_108;
  byte local_e9;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e8;
  byte local_c9;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c8;
  byte local_a9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  byte local_89;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  byte local_69;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_28;
  GibbsSamplerFromHDP *local_10;
  GibbsSamplerFromHDP *this_local;
  
  local_10 = this;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_28,&this->_nkv);
  local_69 = 0;
  local_89 = 0;
  local_a9 = 0;
  local_c9 = 0;
  local_e9 = 0;
  bVar1 = false;
  uVar2 = sum<unsigned_int>(&local_28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,&this->_nk);
  uVar3 = sum<unsigned_int>(&local_50);
  bVar6 = true;
  if (uVar2 == uVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_68,&this->_nk);
    local_69 = 1;
    uVar2 = sum<unsigned_int>(&local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,&this->_nj);
    local_89 = 1;
    uVar3 = sum<unsigned_int>(&local_88);
    bVar6 = true;
    if (uVar2 == uVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,&this->_nj);
      local_a9 = 1;
      uVar2 = sum<unsigned_int>(&local_a8);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_c8,&this->_njt);
      local_c9 = 1;
      uVar3 = sum<unsigned_int>(&local_c8);
      bVar6 = true;
      if (uVar2 == uVar3) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector(&local_e8,&this->_njt);
        local_e9 = 1;
        uVar2 = sum<unsigned_int>(&local_e8);
        std::
        vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
        ::vector(&local_108,&this->_njtv);
        bVar1 = true;
        uVar3 = sum<unsigned_int>(&local_108);
        bVar6 = uVar2 != uVar3;
      }
    }
  }
  if (bVar1) {
    std::
    vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
    ::~vector(&local_108);
  }
  if ((local_e9 & 1) != 0) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_e8);
  }
  if ((local_c9 & 1) != 0) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_c8);
  }
  if ((local_a9 & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
  }
  if ((local_89 & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_88);
  }
  if ((local_69 & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_28);
  if (bVar6) {
    exit(0);
  }
  uVar2 = this->_K;
  sVar4 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(&this->_nkv);
  if (uVar2 == sVar4) {
    sVar4 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::size(&this->_nkv);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_mk);
    if (sVar4 == sVar5) {
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_mk);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_nk);
      if (sVar4 == sVar5) {
        return;
      }
    }
  }
  exit(0);
}

Assistant:

void GibbsSamplerFromHDP::checkNumbers(){//{{{
    if(sum(_nkv) != sum(_nk) || sum(_nk) != sum(_nj) || sum(_nj) != sum(_njt) || sum(_njt) != sum(_njtv))exit(0);
    if(_K != _nkv.size() || _nkv.size() != _mk.size() || _mk.size() != _nk.size())exit(0);
}